

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool wallet::LoadEncryptionKey
               (CWallet *pwallet,DataStream *ssKey,DataStream *ssValue,string *strErr)

{
  long lVar1;
  size_type sVar2;
  CMasterKey *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  exception *e;
  CMasterKey kMasterKey;
  uint nID;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  CMasterKey *in_stack_ffffffffffffff08;
  CMasterKey *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  undefined8 in_stack_ffffffffffffff28;
  map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
  *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int iVar3;
  undefined4 in_stack_ffffffffffffff3c;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff68;
  byte in_stack_ffffffffffffff6f;
  uint local_3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff08);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RCX,in_stack_ffffffffffffff40,
             (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (char *)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff28 >> 0x18,0));
  DataStream::operator>>
            ((DataStream *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
             (uint *)in_stack_ffffffffffffff10);
  CMasterKey::CMasterKey(in_RCX);
  DataStream::operator>>
            ((DataStream *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff10);
  sVar2 = std::
          map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
          ::count((map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                  (key_type_conflict3 *)in_stack_ffffffffffffff10);
  if (sVar2 == 0) {
    std::
    map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
    ::operator[](in_stack_ffffffffffffff30,(key_type_conflict3 *)0x0);
    CMasterKey::operator=
              ((CMasterKey *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10);
    if (*(uint *)&in_RDI[0x12]._M_dataplus._M_p < local_3c) {
      *(uint *)&in_RDI[0x12]._M_dataplus._M_p = local_3c;
    }
    iVar3 = 0;
  }
  else {
    tinyformat::format<unsigned_int>
              ((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (uint *)in_stack_ffffffffffffff30);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),in_RDI);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff6f = 0;
    iVar3 = 1;
  }
  CMasterKey::~CMasterKey(in_stack_ffffffffffffff08);
  if (iVar3 == 0) {
    in_stack_ffffffffffffff6f = 1;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff08);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(in_stack_ffffffffffffff6f & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool LoadEncryptionKey(CWallet* pwallet, DataStream& ssKey, DataStream& ssValue, std::string& strErr)
{
    LOCK(pwallet->cs_wallet);
    try {
        // Master encryption key is loaded into only the wallet and not any of the ScriptPubKeyMans.
        unsigned int nID;
        ssKey >> nID;
        CMasterKey kMasterKey;
        ssValue >> kMasterKey;
        if(pwallet->mapMasterKeys.count(nID) != 0)
        {
            strErr = strprintf("Error reading wallet database: duplicate CMasterKey id %u", nID);
            return false;
        }
        pwallet->mapMasterKeys[nID] = kMasterKey;
        if (pwallet->nMasterKeyMaxID < nID)
            pwallet->nMasterKeyMaxID = nID;

    } catch (const std::exception& e) {
        if (strErr.empty()) {
            strErr = e.what();
        }
        return false;
    }
    return true;
}